

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenPackUnPack_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,IDLOptions *opts,
          bool struct_has_create,
          set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
          *field_has_create)

{
  Value *pVVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  StructDef *pSVar4;
  bool bVar5;
  __type _Var6;
  const_iterator cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *psVar9;
  undefined7 in_register_00000081;
  pointer ppFVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string length_str;
  string camel_name_short;
  string type_name;
  string to_array;
  string create_string_1;
  undefined1 local_1e0 [32];
  string camel_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  IDLOptions *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined4 local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  _Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  *local_e0;
  _Base_ptr local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string struct_name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_104 = (undefined4)CONCAT71(in_register_00000081,struct_has_create);
  local_130 = opts;
  local_e0 = &field_has_create->_M_t;
  GenTypeName_ObjectAPI(&struct_name,this,(string *)struct_def,opts);
  std::operator+(&camel_name_short,"  public ",&struct_name);
  std::operator+(&camel_name,&camel_name_short," UnPack() {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&camel_name);
  std::__cxx11::string::~string((string *)&camel_name_short);
  std::operator+(&camel_name_short,"    var _o = new ",&struct_name);
  std::operator+(&camel_name,&camel_name_short,"();\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&camel_name);
  std::__cxx11::string::~string((string *)&camel_name_short);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&camel_name_short,"  public void UnPackTo(",&struct_name);
  std::operator+(&camel_name,&camel_name_short," _o) {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&camel_name);
  std::__cxx11::string::~string((string *)&camel_name_short);
  for (ppFVar10 = (struct_def->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppFVar10 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
    pFVar3 = *ppFVar10;
    if (pFVar3->deprecated != false) goto LAB_0017b87c;
    Name_abi_cxx11_(&camel_name,this,pFVar3);
    _Var6 = std::operator==(&camel_name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            struct_def);
    if (_Var6) {
      std::__cxx11::string::append((char *)&camel_name);
    }
    Name_abi_cxx11_(&camel_name_short,this,pFVar3);
    std::operator+(&type_name,"    _o.",&camel_name);
    std::operator+(&start,&type_name," = ");
    std::__cxx11::string::~string((string *)&type_name);
    BVar2 = (pFVar3->value).type.base_type;
    if (3 < BVar2 - BASE_TYPE_VECTOR) {
      if (BVar2 != BASE_TYPE_UTYPE) {
        std::operator+(&to_array,&start,"this.");
        std::operator+(&length_str,&to_array,&camel_name);
        std::operator+(&type_name,&length_str,";\n");
        std::__cxx11::string::append((string *)code_ptr);
LAB_0017b44e:
        std::__cxx11::string::~string((string *)&type_name);
        std::__cxx11::string::~string((string *)&length_str);
        psVar9 = &to_array;
        goto LAB_0017b858;
      }
      goto LAB_0017b85d;
    }
    pVVar1 = &pFVar3->value;
    switch(BVar2) {
    case BASE_TYPE_VECTOR:
      BVar2 = (pFVar3->value).type.element;
      if (BVar2 != BASE_TYPE_UTYPE) {
        if (BVar2 == BASE_TYPE_UNION) {
          std::operator+(&to_array,&start,"new ");
          GenTypeGet_ObjectAPI_abi_cxx11_(&create_string_1,this,pVVar1->type,local_130);
          std::operator+(&length_str,&to_array,&create_string_1);
          std::operator+(&type_name,&length_str,"();\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&type_name);
          std::__cxx11::string::~string((string *)&length_str);
          std::__cxx11::string::~string((string *)&create_string_1);
          std::__cxx11::string::~string((string *)&to_array);
          std::operator+(&length_str,"    for (var _j = 0; _j < this.",&camel_name);
          std::operator+(&type_name,&length_str,"Length; ++_j) {\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&type_name);
          std::__cxx11::string::~string((string *)&length_str);
          GenUnionUnPack_ObjectAPI
                    (this,(pFVar3->value).type.enum_def,code_ptr,&camel_name,&camel_name_short,true)
          ;
          std::__cxx11::string::append((char *)code_ptr);
        }
        else {
          pSVar4 = (pFVar3->value).type.struct_def;
          std::operator+(&to_array,&start,"new ");
          GenTypeGet_ObjectAPI_abi_cxx11_(&create_string_1,this,pVVar1->type,local_130);
          std::operator+(&length_str,&to_array,&create_string_1);
          std::operator+(&type_name,&length_str,"();\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&type_name);
          std::__cxx11::string::~string((string *)&length_str);
          std::__cxx11::string::~string((string *)&create_string_1);
          std::__cxx11::string::~string((string *)&to_array);
          std::operator+(&length_str,"    for (var _j = 0; _j < this.",&camel_name);
          std::operator+(&type_name,&length_str,"Length; ++_j) {");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&type_name);
          std::__cxx11::string::~string((string *)&length_str);
          std::operator+(&length_str,"_o.",&camel_name);
          std::operator+(&type_name,&length_str,".Add(");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&type_name);
          std::__cxx11::string::~string((string *)&length_str);
          if (pSVar4 == (StructDef *)0x0) {
            std::operator+(&length_str,"this.",&camel_name);
            std::operator+(&type_name,&length_str,"(_j)");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&type_name);
            psVar9 = &length_str;
          }
          else {
            std::operator+(&create_string_1,"this.",&camel_name);
            std::operator+(&to_array,&create_string_1,"(_j).HasValue ? this.");
            std::operator+(&length_str,&to_array,&camel_name);
            std::operator+(&type_name,&length_str,"(_j).Value.UnPack() : null");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&type_name);
            std::__cxx11::string::~string((string *)&length_str);
            std::__cxx11::string::~string((string *)&to_array);
            psVar9 = &create_string_1;
          }
          std::__cxx11::string::~string((string *)psVar9);
          std::__cxx11::string::append((char *)code_ptr);
        }
      }
      break;
    case BASE_TYPE_STRUCT:
      if ((struct_def->fixed == true) && (((pFVar3->value).type.struct_def)->fixed == true)) {
        std::operator+(&to_array,&start,"this.");
        std::operator+(&length_str,&to_array,&camel_name);
        std::operator+(&type_name,&length_str,".UnPack();\n");
        std::__cxx11::string::append((string *)code_ptr);
        goto LAB_0017b44e;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &start,"this.");
      std::operator+(&create_string_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &camel_name);
      std::operator+(&to_array,&create_string_1,".HasValue ? this.");
      std::operator+(&length_str,&to_array,&camel_name);
      std::operator+(&type_name,&length_str,".Value.UnPack() : null;\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&create_string_1);
      psVar9 = (string *)local_1e0;
      goto LAB_0017b858;
    case BASE_TYPE_UNION:
      GenUnionUnPack_ObjectAPI
                (this,(pFVar3->value).type.enum_def,code_ptr,&camel_name,&camel_name_short,false);
      break;
    case BASE_TYPE_ARRAY:
      GenTypeGet_ObjectAPI_abi_cxx11_(&type_name,this,pVVar1->type,local_130);
      NumToString<unsigned_short>(&length_str,(pFVar3->value).type.fixed_length);
      pSVar4 = (pFVar3->value).type.struct_def;
      pcVar11 = "";
      if ((pSVar4 != (StructDef *)0x0) && (pcVar11 = "?.UnPack()", pSVar4->fixed != false)) {
        pcVar11 = ".UnPack()";
      }
      std::operator+(&local_170,&start,"new ");
      std::__cxx11::string::substr((ulong)&local_150,(ulong)&type_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_170,&local_150);
      std::operator+(&create_string_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &length_str);
      std::operator+(&to_array,&create_string_1,"];\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::operator+(&local_d0,"    for (var _j = 0; _j < ",&length_str);
      std::operator+(&local_100,&local_d0,"; ++_j) { _o.");
      std::operator+(&local_128,&local_100,&camel_name);
      std::operator+(&local_150,&local_128,"[_j] = this.");
      std::operator+(&local_170,&local_150,&camel_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_170,"(_j)");
      std::operator+(&create_string_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     pcVar11);
      std::operator+(&to_array,&create_string_1,"; }\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&length_str);
      psVar9 = &type_name;
LAB_0017b858:
      std::__cxx11::string::~string((string *)psVar9);
    }
LAB_0017b85d:
    std::__cxx11::string::~string((string *)&start);
    std::__cxx11::string::~string((string *)&camel_name_short);
    std::__cxx11::string::~string((string *)&camel_name);
LAB_0017b87c:
  }
  std::__cxx11::string::append((char *)code_ptr);
  GenOffsetType_abi_cxx11_(&length_str,this,struct_def);
  std::operator+(&type_name,"  public static ",&length_str);
  std::operator+(&start,&type_name," Pack(FlatBufferBuilder builder, ");
  std::operator+(&camel_name_short,&start,&struct_name);
  std::operator+(&camel_name,&camel_name_short," _o) {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&camel_name);
  std::__cxx11::string::~string((string *)&camel_name_short);
  std::__cxx11::string::~string((string *)&start);
  std::__cxx11::string::~string((string *)&type_name);
  std::__cxx11::string::~string((string *)&length_str);
  GenOffsetType_abi_cxx11_(&start,this,struct_def);
  std::operator+(&camel_name_short,"    if (_o == null) return default(",&start);
  std::operator+(&camel_name,&camel_name_short,");\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&camel_name);
  std::__cxx11::string::~string((string *)&camel_name_short);
  std::__cxx11::string::~string((string *)&start);
  local_d8 = &(((_Rep_type *)&local_e0->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  for (ppFVar10 = (struct_def->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppFVar10 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
    pFVar3 = *ppFVar10;
    if (pFVar3->deprecated != false) goto LAB_0017d049;
    Name_abi_cxx11_(&camel_name_short,this,pFVar3);
    _Var6 = std::operator==(&camel_name_short,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            struct_def);
    if (_Var6) {
      std::__cxx11::string::append((char *)&camel_name_short);
    }
    Name_abi_cxx11_(&start,this,pFVar3);
    BVar2 = (pFVar3->value).type.base_type;
    if (4 < BVar2 - BASE_TYPE_STRING) goto LAB_0017d02f;
    pVVar1 = &pFVar3->value;
    switch(BVar2) {
    case BASE_TYPE_STRING:
      pcVar11 = "CreateString";
      if (pFVar3->shared != false) {
        pcVar11 = "CreateSharedString";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&camel_name,pcVar11,(allocator<char> *)&type_name);
      std::operator+(&local_128,"    var _",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
      std::operator+(&local_150,&local_128," = _o.");
      std::operator+(&local_170,&local_150,&camel_name_short);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_170," == null ? default(StringOffset) : builder.");
      std::operator+(&create_string_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &camel_name);
      std::operator+(&to_array,&create_string_1,"(_o.");
      std::operator+(&length_str,&to_array,&camel_name_short);
      std::operator+(&type_name,&length_str,");\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      pbVar8 = &local_128;
LAB_0017d01d:
      std::__cxx11::string::~string((string *)pbVar8);
      goto LAB_0017d022;
    case BASE_TYPE_VECTOR:
      camel_name._M_dataplus._M_p = (pointer)pFVar3;
      cVar7 = std::
              _Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
              ::find(local_e0,(key_type *)&camel_name);
      if (cVar7._M_node != local_d8) {
        std::__cxx11::string::string((string *)&camel_name,(string *)&camel_name_short);
        std::operator+(&type_name,"__",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&length_str,"",(allocator<char> *)&to_array);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&to_array,"",(allocator<char> *)&create_string_1);
        BVar2 = (pFVar3->value).type.element;
        if (BVar2 == BASE_TYPE_UTYPE) {
          std::__cxx11::string::substr((ulong)&create_string_1,(ulong)&camel_name_short);
          std::__cxx11::string::operator=((string *)&camel_name,(string *)&create_string_1);
          std::__cxx11::string::~string((string *)&create_string_1);
          NamespacedName_abi_cxx11_
                    (&create_string_1,this,&((pFVar3->value).type.enum_def)->super_Definition);
          std::__cxx11::string::operator=((string *)&length_str,(string *)&create_string_1);
          std::__cxx11::string::~string((string *)&create_string_1);
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
          std::operator+(pbVar8,"_o.",&camel_name);
          std::operator+(&create_string_1,pbVar8,"[_j].Type");
          std::__cxx11::string::operator=((string *)&to_array,(string *)&create_string_1);
          std::__cxx11::string::~string((string *)&create_string_1);
LAB_0017cbdd:
          std::__cxx11::string::~string((string *)pbVar8);
          bVar5 = true;
        }
        else {
          if (BVar2 == BASE_TYPE_STRING) {
            pcVar11 = "CreateString";
            if (pFVar3->shared != false) {
              pcVar11 = "CreateSharedString";
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&create_string_1,pcVar11,(allocator<char> *)local_1e0);
            std::__cxx11::string::assign((char *)&length_str);
            std::operator+(&local_128,"builder.",&create_string_1);
            std::operator+(&local_150,&local_128,"(_o.");
            std::operator+(&local_170,&local_150,&camel_name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,&local_170,"[_j])");
            std::__cxx11::string::append((string *)&to_array);
            std::__cxx11::string::~string((string *)local_1e0);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_128);
            pbVar8 = &create_string_1;
            goto LAB_0017cbdd;
          }
          if (BVar2 == BASE_TYPE_STRUCT) {
            GenTypeGet_abi_cxx11_(&local_170,this,&pVVar1->type);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,"Offset<",&local_170);
            std::operator+(&create_string_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,">");
            std::__cxx11::string::operator=((string *)&length_str,(string *)&create_string_1);
            std::__cxx11::string::~string((string *)&create_string_1);
            std::__cxx11::string::~string((string *)local_1e0);
            std::__cxx11::string::~string((string *)&local_170);
            GenTypeGet_abi_cxx11_(&local_150,this,&pVVar1->type);
            std::operator+(&local_170,&local_150,".Pack(builder, _o.");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,&local_170,&camel_name);
            std::operator+(&create_string_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,"[_j])");
LAB_0017caf7:
            std::__cxx11::string::operator=((string *)&to_array,(string *)&create_string_1);
            std::__cxx11::string::~string((string *)&create_string_1);
            std::__cxx11::string::~string((string *)local_1e0);
            std::__cxx11::string::~string((string *)&local_170);
            pbVar8 = &local_150;
            goto LAB_0017cbdd;
          }
          if (BVar2 == BASE_TYPE_UNION) {
            std::__cxx11::string::assign((char *)&length_str);
            NamespacedName_abi_cxx11_
                      (&local_150,this,&((pFVar3->value).type.enum_def)->super_Definition);
            std::operator+(&local_170,&local_150,"Union.Pack(builder,  _o.");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,&local_170,&camel_name);
            std::operator+(&create_string_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,"[_j])");
            goto LAB_0017caf7;
          }
          bVar5 = false;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        std::operator+(&create_string_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0," = default(VectorOffset);\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&create_string_1);
        std::__cxx11::string::~string((string *)local_1e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,"    if (_o.",&camel_name);
        std::operator+(&create_string_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0," != null) {\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&create_string_1);
        std::__cxx11::string::~string((string *)local_1e0);
        if (bVar5) {
          std::operator+(&local_100,"      var ",&type_name);
          std::operator+(&local_128,&local_100," = new ");
          std::operator+(&local_150,&local_128,&length_str);
          std::operator+(&local_170,&local_150,"[_o.");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,&local_170,&camel_name);
          std::operator+(&create_string_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,".Count];\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&create_string_1);
          std::__cxx11::string::~string((string *)local_1e0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_100);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,"      for (var _j = 0; _j < ",&type_name);
          std::operator+(&create_string_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,".Length; ++_j) { ");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&create_string_1);
          std::__cxx11::string::~string((string *)local_1e0);
          std::operator+(&local_170,&type_name,"[_j] = ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,&local_170,&to_array);
          std::operator+(&create_string_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,"; }\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&create_string_1);
          std::__cxx11::string::~string((string *)local_1e0);
          pbVar8 = &local_170;
        }
        else {
          std::operator+(&local_150,"      var ",&type_name);
          std::operator+(&local_170,&local_150," = _o.");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,&local_170,&camel_name);
          std::operator+(&create_string_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0,".ToArray();\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&create_string_1);
          std::__cxx11::string::~string((string *)local_1e0);
          std::__cxx11::string::~string((string *)&local_170);
          pbVar8 = &local_150;
        }
        std::__cxx11::string::~string((string *)pbVar8);
        std::operator+(&local_100,"      _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        std::operator+(&local_128,&local_100," = Create");
        std::operator+(&local_150,&local_128,&start);
        std::operator+(&local_170,&local_150,"Vector(builder, ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,&local_170,&type_name);
        std::operator+(&create_string_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,");\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&create_string_1);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::~string((string *)&to_array);
        std::__cxx11::string::~string((string *)&length_str);
        pbVar8 = &type_name;
        goto LAB_0017d01d;
      }
      if ((pFVar3->value).type.struct_def == (StructDef *)0x0) {
        local_1e0._0_4_ = (pFVar3->value).type.element;
        local_1e0._16_8_ = (pFVar3->value).type.enum_def;
        local_1e0._24_2_ = (pFVar3->value).type.fixed_length;
        local_1e0._4_4_ = BASE_TYPE_NONE;
        local_1e0._8_8_ = (StructDef *)0x0;
        GenMethod_abi_cxx11_(&create_string_1,this,(Type *)local_1e0);
        std::operator+(&to_array,"builder.Add",&create_string_1);
        std::operator+(&length_str,&to_array,"(_o.");
        std::operator+(&type_name,&length_str,&camel_name_short);
        std::operator+(&camel_name,&type_name,"[_j]);");
        std::__cxx11::string::~string((string *)&type_name);
        std::__cxx11::string::~string((string *)&length_str);
        std::__cxx11::string::~string((string *)&to_array);
        psVar9 = &create_string_1;
      }
      else {
        GenTypeGet_abi_cxx11_(&to_array,this,&pVVar1->type);
        std::operator+(&length_str,&to_array,".Pack(builder, _o.");
        std::operator+(&type_name,&length_str,&camel_name_short);
        std::operator+(&camel_name,&type_name,"[_j]);");
        std::__cxx11::string::~string((string *)&type_name);
        std::__cxx11::string::~string((string *)&length_str);
        psVar9 = &to_array;
      }
      std::__cxx11::string::~string((string *)psVar9);
      std::operator+(&length_str,"    var _",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
      std::operator+(&type_name,&length_str," = default(VectorOffset);\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::operator+(&length_str,"    if (_o.",&camel_name_short);
      std::operator+(&type_name,&length_str," != null) {\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::operator+(&create_string_1,"      Start",&start);
      std::operator+(&to_array,&create_string_1,"Vector(builder, _o.");
      std::operator+(&length_str,&to_array,&camel_name_short);
      std::operator+(&type_name,&length_str,".Count);\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::operator+(&create_string_1,"      for (var _j = _o.",&camel_name_short);
      std::operator+(&to_array,&create_string_1,".Count - 1; _j >= 0; --_j) { ");
      std::operator+(&length_str,&to_array,&camel_name);
      std::operator+(&type_name,&length_str," }\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::operator+(&length_str,"      _",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
      std::operator+(&type_name,&length_str," = builder.EndVector();\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::append((char *)code_ptr);
LAB_0017d022:
      pbVar8 = &camel_name;
      break;
    case BASE_TYPE_STRUCT:
      if (((pFVar3->value).type.struct_def)->fixed != false) {
        if ((struct_def->fixed & (byte)local_104) == 1) {
          type_name._M_dataplus._M_p = (pointer)0x0;
          type_name._M_string_length = 0;
          type_name.field_2._M_allocated_capacity = 0;
          std::__cxx11::string::string((string *)&camel_name,(string *)pFVar3);
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       *)&type_name,(value_type *)&camel_name);
          GenStructPackDecl_ObjectAPI
                    (this,(pFVar3->value).type.struct_def,code_ptr,
                     (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      *)&type_name);
          goto LAB_0017bf40;
        }
        goto LAB_0017d02f;
      }
      std::operator+(&local_100,"    var _",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
      std::operator+(&local_128,&local_100," = _o.");
      std::operator+(&local_150,&local_128,&camel_name_short);
      std::operator+(&local_170,&local_150," == null ? default(");
      GenOffsetType_abi_cxx11_(&local_d0,this,(pFVar3->value).type.struct_def);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_170,&local_d0);
      std::operator+(&create_string_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     ") : ");
      GenTypeGet_abi_cxx11_(&local_90,this,&pVVar1->type);
      std::operator+(&to_array,&create_string_1,&local_90);
      std::operator+(&length_str,&to_array,".Pack(builder, _o.");
      std::operator+(&type_name,&length_str,&camel_name_short);
      std::operator+(&camel_name,&type_name,");\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&camel_name);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      pbVar8 = &local_100;
      break;
    case BASE_TYPE_UNION:
      std::operator+(&local_128,"    var _",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
      std::operator+(&local_150,&local_128,"_type = _o.");
      std::operator+(&local_170,&local_150,&camel_name_short);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_170," == null ? ");
      NamespacedName_abi_cxx11_(&local_100,this,&((pFVar3->value).type.enum_def)->super_Definition);
      std::operator+(&create_string_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_100);
      std::operator+(&to_array,&create_string_1,".NONE : ");
      std::operator+(&length_str,&to_array,"_o.");
      std::operator+(&type_name,&length_str,&camel_name_short);
      std::operator+(&camel_name,&type_name,".Type;\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&camel_name);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_128);
      std::operator+(&local_150,"    var _",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
      std::operator+(&local_170,&local_150," = _o.");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     &local_170,&camel_name_short);
      std::operator+(&create_string_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     " == null ? 0 : ");
      GenTypeGet_ObjectAPI_abi_cxx11_(&local_128,this,pVVar1->type,local_130);
      std::operator+(&to_array,&create_string_1,&local_128);
      std::operator+(&length_str,&to_array,".Pack(builder, _o.");
      std::operator+(&type_name,&length_str,&camel_name_short);
      std::operator+(&camel_name,&type_name,");\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&camel_name);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      std::__cxx11::string::~string((string *)&to_array);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&create_string_1);
      std::__cxx11::string::~string((string *)local_1e0);
      std::__cxx11::string::~string((string *)&local_170);
      pbVar8 = &local_150;
      break;
    case BASE_TYPE_ARRAY:
      if ((pFVar3->value).type.struct_def != (StructDef *)0x0) {
        type_name._M_dataplus._M_p = (pointer)0x0;
        type_name._M_string_length = 0;
        type_name.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string((string *)&camel_name,(string *)pFVar3);
        std::
        vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                     *)&type_name,(value_type *)&camel_name);
        GenStructPackDecl_ObjectAPI
                  (this,(pFVar3->value).type.struct_def,code_ptr,
                   (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                    *)&type_name);
LAB_0017bf40:
        std::__cxx11::string::~string((string *)&camel_name);
        std::
        vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
        ::~vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   *)&type_name);
        goto LAB_0017d02f;
      }
      std::operator+(&to_array,"    var _",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
      std::operator+(&length_str,&to_array," = _o.");
      std::operator+(&type_name,&length_str,&camel_name_short);
      std::operator+(&camel_name,&type_name,";\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&camel_name);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&length_str);
      pbVar8 = &to_array;
    }
    std::__cxx11::string::~string((string *)pbVar8);
LAB_0017d02f:
    std::__cxx11::string::~string((string *)&start);
    std::__cxx11::string::~string((string *)&camel_name_short);
LAB_0017d049:
  }
  if ((byte)local_104 == '\0') {
    std::operator+(&camel_name_short,"    Start",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&camel_name,&camel_name_short,"(builder);\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&camel_name);
    std::__cxx11::string::~string((string *)&camel_name_short);
    for (ppFVar10 = (struct_def->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppFVar10 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
      pFVar3 = *ppFVar10;
      if (pFVar3->deprecated == false) {
        Name_abi_cxx11_(&camel_name,this,pFVar3);
        BVar2 = (pFVar3->value).type.base_type;
        switch(BVar2) {
        case BASE_TYPE_STRING:
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_ARRAY:
          std::operator+(&length_str,"    Add",&camel_name);
          std::operator+(&type_name,&length_str,"(builder, _");
          std::operator+(&start,&type_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3
                        );
          std::operator+(&camel_name_short,&start,");\n");
          std::__cxx11::string::append((string *)code_ptr);
          break;
        case BASE_TYPE_STRUCT:
          if (((pFVar3->value).type.struct_def)->fixed != true) {
            std::operator+(&length_str,"    Add",&camel_name);
            std::operator+(&type_name,&length_str,"(builder, _");
            std::operator+(&start,&type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar3);
            std::operator+(&camel_name_short,&start,");\n");
            std::__cxx11::string::append((string *)code_ptr);
            break;
          }
          std::operator+(&create_string_1,"    Add",&camel_name);
          std::operator+(&to_array,&create_string_1,"(builder, ");
          GenTypeGet_abi_cxx11_((string *)local_1e0,this,&(pFVar3->value).type);
          std::operator+(&length_str,&to_array,(string *)local_1e0);
          std::operator+(&type_name,&length_str,".Pack(builder, _o.");
          std::operator+(&start,&type_name,&camel_name);
          std::operator+(&camel_name_short,&start,"));\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&camel_name_short);
          std::__cxx11::string::~string((string *)&start);
          std::__cxx11::string::~string((string *)&type_name);
          std::__cxx11::string::~string((string *)&length_str);
          std::__cxx11::string::~string((string *)local_1e0);
          std::__cxx11::string::~string((string *)&to_array);
          psVar9 = &create_string_1;
          goto LAB_0017d839;
        case BASE_TYPE_UNION:
          std::operator+(&length_str,"    Add",&camel_name);
          std::operator+(&type_name,&length_str,"Type(builder, _");
          std::operator+(&start,&type_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3
                        );
          std::operator+(&camel_name_short,&start,"_type);\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&camel_name_short);
          std::__cxx11::string::~string((string *)&start);
          std::__cxx11::string::~string((string *)&type_name);
          std::__cxx11::string::~string((string *)&length_str);
          std::operator+(&length_str,"    Add",&camel_name);
          std::operator+(&type_name,&length_str,"(builder, _");
          std::operator+(&start,&type_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3
                        );
          std::operator+(&camel_name_short,&start,");\n");
          std::__cxx11::string::append((string *)code_ptr);
          break;
        default:
          if (BVar2 != BASE_TYPE_UTYPE) {
            std::operator+(&length_str,"    Add",&camel_name);
            std::operator+(&type_name,&length_str,"(builder, _o.");
            std::operator+(&start,&type_name,&camel_name);
            std::operator+(&camel_name_short,&start,");\n");
            std::__cxx11::string::append((string *)code_ptr);
            break;
          }
          goto LAB_0017d83e;
        }
        std::__cxx11::string::~string((string *)&camel_name_short);
        std::__cxx11::string::~string((string *)&start);
        std::__cxx11::string::~string((string *)&type_name);
        psVar9 = &length_str;
LAB_0017d839:
        std::__cxx11::string::~string((string *)psVar9);
LAB_0017d83e:
        std::__cxx11::string::~string((string *)&camel_name);
      }
    }
    std::operator+(&camel_name_short,"    return End",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&camel_name,&camel_name_short,"(builder);\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&camel_name);
    std::__cxx11::string::~string((string *)&camel_name_short);
  }
  else {
    std::operator+(&camel_name_short,"    return Create",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&camel_name,&camel_name_short,"(\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&camel_name);
    std::__cxx11::string::~string((string *)&camel_name_short);
    std::__cxx11::string::append((char *)code_ptr);
    for (ppFVar10 = (struct_def->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppFVar10 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
      pFVar3 = *ppFVar10;
      if (pFVar3->deprecated == false) {
        Name_abi_cxx11_(&camel_name,this,pFVar3);
        _Var6 = std::operator==(&camel_name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )struct_def);
        if (_Var6) {
          std::__cxx11::string::append((char *)&camel_name);
        }
        BVar2 = (pFVar3->value).type.base_type;
        pbVar8 = &camel_name_short;
        switch(BVar2) {
        case BASE_TYPE_STRING:
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_UNION:
switchD_0017d154_caseD_d:
          std::__cxx11::string::append((char *)code_ptr);
          std::operator+(&camel_name_short,"      _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3
                        );
          std::__cxx11::string::append((string *)code_ptr);
          break;
        case BASE_TYPE_STRUCT:
          if (struct_def->fixed == true) {
            pSVar4 = (pFVar3->value).type.struct_def;
            std::operator+(&camel_name_short,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar3);
            __return_storage_ptr__ = &local_50;
            std::operator+(__return_storage_ptr__,&camel_name_short,"_");
            GenStructPackCall_ObjectAPI(this,pSVar4,code_ptr,__return_storage_ptr__);
LAB_0017d275:
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
          }
          else {
            std::__cxx11::string::append((char *)code_ptr);
            if (((pFVar3->value).type.struct_def)->fixed == true) {
              if (local_130->generate_object_based_api == true) {
                std::operator+(&camel_name_short,"      _o.",&camel_name);
                std::__cxx11::string::append((string *)code_ptr);
              }
              else {
                GenTypeGet_abi_cxx11_(&to_array,this,&(pFVar3->value).type);
                std::operator+(&length_str,"      ",&to_array);
                std::operator+(&type_name,&length_str,".Pack(builder, _o.");
                std::operator+(&start,&type_name,&camel_name);
                std::operator+(&camel_name_short,&start,")");
                std::__cxx11::string::append((string *)code_ptr);
                std::__cxx11::string::~string((string *)&camel_name_short);
                std::__cxx11::string::~string((string *)&start);
                std::__cxx11::string::~string((string *)&type_name);
                std::__cxx11::string::~string((string *)&length_str);
                pbVar8 = &to_array;
              }
            }
            else {
              std::operator+(&camel_name_short,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar3);
              std::__cxx11::string::append((string *)code_ptr);
            }
          }
          break;
        case BASE_TYPE_ARRAY:
          pSVar4 = (pFVar3->value).type.struct_def;
          if (pSVar4 != (StructDef *)0x0) {
            std::operator+(&camel_name_short,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar3);
            __return_storage_ptr__ = &local_70;
            std::operator+(__return_storage_ptr__,&camel_name_short,"_");
            GenStructPackCall_ObjectAPI(this,pSVar4,code_ptr,__return_storage_ptr__);
            goto LAB_0017d275;
          }
          std::__cxx11::string::append((char *)code_ptr);
          std::operator+(&camel_name_short,"      _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3
                        );
          std::__cxx11::string::append((string *)code_ptr);
          break;
        default:
          if (BVar2 == BASE_TYPE_UTYPE) goto switchD_0017d154_caseD_d;
          std::__cxx11::string::append((char *)code_ptr);
          std::operator+(&camel_name_short,"      _o.",&camel_name);
          std::__cxx11::string::append((string *)code_ptr);
        }
        std::__cxx11::string::~string((string *)pbVar8);
        std::__cxx11::string::~string((string *)&camel_name);
      }
    }
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::~string((string *)&struct_name);
  return;
}

Assistant:

void GenPackUnPack_ObjectAPI(
      StructDef &struct_def, std::string *code_ptr, const IDLOptions &opts,
      bool struct_has_create,
      const std::set<FieldDef *> &field_has_create) const {
    auto &code = *code_ptr;
    auto struct_name = GenTypeName_ObjectAPI(struct_def.name, opts);
    // UnPack()
    code += "  public " + struct_name + " UnPack() {\n";
    code += "    var _o = new " + struct_name + "();\n";
    code += "    this.UnPackTo(_o);\n";
    code += "    return _o;\n";
    code += "  }\n";
    // UnPackTo()
    code += "  public void UnPackTo(" + struct_name + " _o) {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      auto start = "    _o." + camel_name + " = ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          auto fixed = struct_def.fixed && field.value.type.struct_def->fixed;
          if (fixed) {
            code += start + "this." + camel_name + ".UnPack();\n";
          } else {
            code += start + "this." + camel_name + ".HasValue ? this." +
                    camel_name + ".Value.UnPack() : null;\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
          auto length_str = NumToString(field.value.type.fixed_length);
          auto unpack_method = field.value.type.struct_def == nullptr ? ""
                               : field.value.type.struct_def->fixed
                                   ? ".UnPack()"
                                   : "?.UnPack()";
          code += start + "new " + type_name.substr(0, type_name.length() - 1) +
                  length_str + "];\n";
          code += "    for (var _j = 0; _j < " + length_str + "; ++_j) { _o." +
                  camel_name + "[_j] = this." + camel_name + "(_j)" +
                  unpack_method + "; }\n";
          break;
        }
        case BASE_TYPE_VECTOR:
          if (field.value.type.element == BASE_TYPE_UNION) {
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {\n";
            GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                     camel_name, camel_name_short, true);
            code += "    }\n";
          } else if (field.value.type.element != BASE_TYPE_UTYPE) {
            auto fixed = field.value.type.struct_def == nullptr;
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {";
            code += "_o." + camel_name + ".Add(";
            if (fixed) {
              code += "this." + camel_name + "(_j)";
            } else {
              code += "this." + camel_name + "(_j).HasValue ? this." +
                      camel_name + "(_j).Value.UnPack() : null";
            }
            code += ");}\n";
          }
          break;
        case BASE_TYPE_UTYPE: break;
        case BASE_TYPE_UNION: {
          GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                   camel_name, camel_name_short, false);
          break;
        }
        default: {
          code += start + "this." + camel_name + ";\n";
          break;
        }
      }
    }
    code += "  }\n";
    // Pack()
    code += "  public static " + GenOffsetType(struct_def) +
            " Pack(FlatBufferBuilder builder, " + struct_name + " _o) {\n";
    code += "    if (_o == null) return default(" + GenOffsetType(struct_def) +
            ");\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      // pre
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          if (!field.value.type.struct_def->fixed) {
            code += "    var _" + field.name + " = _o." + camel_name +
                    " == null ? default(" +
                    GenOffsetType(*field.value.type.struct_def) +
                    ") : " + GenTypeGet(field.value.type) +
                    ".Pack(builder, _o." + camel_name + ");\n";
          } else if (struct_def.fixed && struct_has_create) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          std::string create_string =
              field.shared ? "CreateSharedString" : "CreateString";
          code += "    var _" + field.name + " = _o." + camel_name +
                  " == null ? default(StringOffset) : "
                  "builder." +
                  create_string + "(_o." + camel_name + ");\n";
          break;
        }
        case BASE_TYPE_VECTOR: {
          if (field_has_create.find(&field) != field_has_create.end()) {
            auto property_name = camel_name;
            auto gen_for_loop = true;
            std::string array_name = "__" + field.name;
            std::string array_type = "";
            std::string to_array = "";
            switch (field.value.type.element) {
              case BASE_TYPE_STRING: {
                std::string create_string =
                    field.shared ? "CreateSharedString" : "CreateString";
                array_type = "StringOffset";
                to_array += "builder." + create_string + "(_o." +
                            property_name + "[_j])";
                break;
              }
              case BASE_TYPE_STRUCT:
                array_type = "Offset<" + GenTypeGet(field.value.type) + ">";
                to_array = GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                           property_name + "[_j])";
                break;
              case BASE_TYPE_UTYPE:
                property_name = camel_name.substr(0, camel_name.size() - 4);
                array_type = NamespacedName(*field.value.type.enum_def);
                to_array = "_o." + property_name + "[_j].Type";
                break;
              case BASE_TYPE_UNION:
                array_type = "int";
                to_array = NamespacedName(*field.value.type.enum_def) +
                           "Union.Pack(builder,  _o." + property_name + "[_j])";
                break;
              default: gen_for_loop = false; break;
            }
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + property_name + " != null) {\n";
            if (gen_for_loop) {
              code += "      var " + array_name + " = new " + array_type +
                      "[_o." + property_name + ".Count];\n";
              code += "      for (var _j = 0; _j < " + array_name +
                      ".Length; ++_j) { ";
              code += array_name + "[_j] = " + to_array + "; }\n";
            } else {
              code += "      var " + array_name + " = _o." + property_name +
                      ".ToArray();\n";
            }
            code += "      _" + field.name + " = Create" + camel_name_short +
                    "Vector(builder, " + array_name + ");\n";
            code += "    }\n";
          } else {
            auto pack_method =
                field.value.type.struct_def == nullptr
                    ? "builder.Add" + GenMethod(field.value.type.VectorType()) +
                          "(_o." + camel_name + "[_j]);"
                    : GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                          camel_name + "[_j]);";
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + camel_name + " != null) {\n";
            code += "      Start" + camel_name_short + "Vector(builder, _o." +
                    camel_name + ".Count);\n";
            code += "      for (var _j = _o." + camel_name +
                    ".Count - 1; _j >= 0; --_j) { " + pack_method + " }\n";
            code += "      _" + field.name + " = builder.EndVector();\n";
            code += "    }\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          if (field.value.type.struct_def != nullptr) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          } else {
            code += "    var _" + field.name + " = _o." + camel_name + ";\n";
          }
          break;
        }
        case BASE_TYPE_UNION: {
          code += "    var _" + field.name + "_type = _o." + camel_name +
                  " == null ? " + NamespacedName(*field.value.type.enum_def) +
                  ".NONE : " + "_o." + camel_name + ".Type;\n";
          code +=
              "    var _" + field.name + " = _o." + camel_name +
              " == null ? 0 : " + GenTypeGet_ObjectAPI(field.value.type, opts) +
              ".Pack(builder, _o." + camel_name + ");\n";
          break;
        }
        default: break;
      }
    }
    if (struct_has_create) {
      // Create
      code += "    return Create" + struct_def.name + "(\n";
      code += "      builder";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        if (camel_name == struct_def.name) { camel_name += "_"; }
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (struct_def.fixed) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              if (field.value.type.struct_def->fixed) {
                if (opts.generate_object_based_api)
                  code += "      _o." + camel_name;
                else
                  code += "      " + GenTypeGet(field.value.type) +
                          ".Pack(builder, _o." + camel_name + ")";
              } else {
                code += "      _" + field.name;
              }
            }
            break;
          }
          case BASE_TYPE_ARRAY: {
            if (field.value.type.struct_def != nullptr) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              code += "      _" + field.name;
            }
            break;
          }
          case BASE_TYPE_UNION: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_UTYPE: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_VECTOR: {
            code += ",\n";
            code += "      _" + field.name;
            break;
          }
          default:  // scalar
            code += ",\n";
            code += "      _o." + camel_name;
            break;
        }
      }
      code += ");\n";
    } else {
      // Start, End
      code += "    Start" + struct_def.name + "(builder);\n";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (field.value.type.struct_def->fixed) {
              code += "    Add" + camel_name + "(builder, " +
                      GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                      camel_name + "));\n";
            } else {
              code +=
                  "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            }
            break;
          }
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_VECTOR: {
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          case BASE_TYPE_UTYPE: break;
          case BASE_TYPE_UNION: {
            code += "    Add" + camel_name + "Type(builder, _" + field.name +
                    "_type);\n";
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          // scalar
          default: {
            code +=
                "    Add" + camel_name + "(builder, _o." + camel_name + ");\n";
            break;
          }
        }
      }
      code += "    return End" + struct_def.name + "(builder);\n";
    }
    code += "  }\n";
  }